

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O2

Validator * __thiscall
CLI::Validator::description
          (Validator *__return_storage_ptr__,Validator *this,string *validator_desc)

{
  anon_class_32_1_5ff8519c local_30;
  
  Validator(__return_storage_ptr__,this);
  ::std::__cxx11::string::string((string *)&local_30,(string *)validator_desc);
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE Validator Validator::description(std::string validator_desc) const {
    Validator newval(*this);
    newval.desc_function_ = [validator_desc]() { return validator_desc; };
    return newval;
}